

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

double __thiscall icu_63::Calendar::getTimeInMillis(Calendar *this,UErrorCode *status)

{
  UDate UVar1;
  
  if (U_ZERO_ERROR < *status) {
    return 0.0;
  }
  if (this->fIsTimeSet == '\0') {
    (*(this->super_UObject)._vptr_UObject[0x1c])(this,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((this->fLenient != '\0') || (this->fAreAllFieldsSet == '\0')) {
        this->fAreFieldsSet = '\0';
      }
      this->fIsTimeSet = '\x01';
      this->fAreFieldsVirtuallySet = '\0';
    }
  }
  UVar1 = 0.0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar1 = this->fTime;
  }
  return UVar1;
}

Assistant:

double
Calendar::getTimeInMillis(UErrorCode& status) const
{
    if(U_FAILURE(status))
        return 0.0;

    if ( ! fIsTimeSet)
        ((Calendar*)this)->updateTime(status);

    /* Test for buffer overflows */
    if(U_FAILURE(status)) {
        return 0.0;
    }
    return fTime;
}